

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

int __thiscall KMaxDistance::getNumMaxRecs(KMaxDistance *this,MaxRec *srcRec)

{
  int cnt;
  
  cnt = 0;
  for (; srcRec != (MaxRec *)0x0; srcRec = (MaxRec *)srcRec->next) {
    cnt = (cnt + 1) - (uint)(srcRec->isUsed == 0);
  }
  return cnt;
}

Assistant:

int KMaxDistance::getNumMaxRecs( MaxRec *srcRec ){
    int cnt = 0;
    MaxRec *rec = srcRec;
    while ( rec != NULL ){
        if ( rec->isUsed ) cnt++;
        rec = (MaxRec*)rec->next;
    }
    return cnt;
}